

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

boolean e_survives_at(entity *etmp,int x,int y)

{
  uint uVar1;
  uint uVar2;
  level *lev;
  boolean bVar3;
  byte bVar4;
  permonst *ppVar5;
  bool bVar6;
  
  lev = level;
  ppVar5 = etmp->edata;
  bVar6 = true;
  if (ppVar5->mlet == '6') {
    return '\x01';
  }
  bVar3 = is_pool(level,x,y);
  if (bVar3 == '\0') {
    bVar3 = is_lava(lev,x,y);
    if (bVar3 == '\0') {
      if (lev->locations[x][y].typ != '\f') {
        return '\x01';
      }
      if ((etmp->emon == &youmonst) &&
         (ppVar5 = youmonst.data, u.uprops[0x3e].extrinsic != 0 || u.uprops[0x3e].intrinsic != 0)) {
        return '\x01';
      }
      bVar4 = (byte)ppVar5->mflags1 >> 3;
    }
    else {
      if (etmp->emon == &youmonst) {
        if (u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) {
          return '\x01';
        }
        if ((youmonst.data)->mlet == '\x05') {
          return '\x01';
        }
        if (u.uprops[0x3c].extrinsic != 0) {
          return '\x01';
        }
        if (((youmonst.data)->mflags1 & 1) != 0) {
          return '\x01';
        }
        if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 1) != 0)) {
          return '\x01';
        }
      }
      if (ppVar5 == mons + 0x157 || ppVar5 == mons + 0xa0) {
        return '\x01';
      }
      bVar4 = (byte)ppVar5->mflags1;
    }
    return bVar4 & 1;
  }
  if (etmp->emon == &youmonst) {
    if ((u.uprops[0x27].extrinsic != 0) &&
       (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 == '\0')) {
      return '\x01';
    }
    if (u.uprops[0x31].intrinsic != 0) {
      return '\x01';
    }
    if (u.uprops[0x31].extrinsic != 0) {
      return '\x01';
    }
    uVar1 = (youmonst.data)->mflags1;
    if ((uVar1 & 2) != 0) {
      return '\x01';
    }
    if ((uVar1 & 0x600) != 0) {
      return '\x01';
    }
    if (u.uprops[0x39].intrinsic != 0) {
      return '\x01';
    }
    if (u.uprops[0x39].extrinsic != 0) {
      return '\x01';
    }
    if (u.usteed == (monst *)0x0) {
      if (((uVar1 & 1) != 0 || u.uprops[0x3c].extrinsic != 0) || u.uprops[0x12].intrinsic != 0) {
        return '\x01';
      }
    }
    else {
      uVar2 = (u.usteed)->data->mflags1;
      if (((uVar1 & 1) != 0 || u.uprops[0x3c].extrinsic != 0) || (uVar2 & 2) != 0) {
        return '\x01';
      }
      if ((uVar2 & 1) != 0 || u.uprops[0x12].intrinsic != 0) {
        return '\x01';
      }
    }
    if (u.uprops[0x12].extrinsic != 0) {
      return '\x01';
    }
    if ((youmonst.data)->mlet == '\x05') {
      return '\x01';
    }
    ppVar5 = etmp->edata;
  }
  if ((ppVar5->mflags1 & 3) == 0) {
    bVar6 = ppVar5->mlet == '\x05';
  }
  return bVar6;
}

Assistant:

static boolean e_survives_at(struct entity *etmp, int x, int y)
{
	if (noncorporeal(etmp->edata))
		return TRUE;
	if (is_pool(level, x, y))
		return (boolean)((is_u(etmp) &&
				(Wwalking || Amphibious || Swimming ||
				Flying || Levitation)) ||
			is_swimmer(etmp->edata) || is_flyer(etmp->edata) ||
			is_floater(etmp->edata));
	/* must force call to lava_effects in e_died if is_u */
	if (is_lava(level, x, y))
		return (boolean)((is_u(etmp) && (Levitation || Flying)) ||
			    likes_lava(etmp->edata) || is_flyer(etmp->edata));
	if (is_db_wall(x, y))
		return((boolean)(is_u(etmp) ? Passes_walls :
			passes_walls(etmp->edata)));
	return TRUE;
}